

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall
Genome::Genome(Genome *this,string *name,int length,double transcript_degradation_rate_ext,
              double rnase_speed,double rnase_footprint,double transcript_degradation_rate)

{
  runtime_error *this_00;
  double transcript_degradation_rate_local;
  double rnase_footprint_local;
  double rnase_speed_local;
  double transcript_degradation_rate_ext_local;
  int length_local;
  string *name_local;
  Genome *this_local;
  
  Polymer::Polymer(&this->super_Polymer,name,1,length);
  (this->super_Polymer)._vptr_Polymer = (_func_int **)&PTR_Initialize_002aa618;
  Signal<std::shared_ptr<Transcript>_>::Signal(&this->transcript_signal_);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::vector(&this->transcript_rbs_intervals_);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::vector(&this->transcript_stop_site_intervals_);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::IntervalTree(&this->transcript_rbs_);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree
            (&this->transcript_stop_sites_);
  std::__cxx11::string::string((string *)&this->seq_);
  std::vector<double,_std::allocator<double>_>::vector(&this->weights_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  ::map(&this->bindings_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&this->rnase_bindings_);
  this->transcript_degradation_rate_ = transcript_degradation_rate;
  this->transcript_degradation_rate_ext_ = transcript_degradation_rate_ext;
  this->rnase_speed_ = rnase_speed;
  this->rnase_footprint_ = (int)rnase_footprint;
  if (((((transcript_degradation_rate_ext != 0.0) || (NAN(transcript_degradation_rate_ext))) ||
       (transcript_degradation_rate != 0.0)) || (NAN(transcript_degradation_rate))) &&
     (((this->rnase_speed_ == 0.0 && (!NAN(this->rnase_speed_))) || (this->rnase_footprint_ == 0))))
  {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Please specify \'rnase_speed\' and/or \'rnase_footprint\'");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Genome::Genome(const std::string &name, int length,
               double transcript_degradation_rate_ext,
               double rnase_speed, double rnase_footprint,
               double transcript_degradation_rate)
    : Polymer(name, 1, length),
      transcript_degradation_rate_(transcript_degradation_rate),
      transcript_degradation_rate_ext_(transcript_degradation_rate_ext),
      rnase_speed_(rnase_speed),
      rnase_footprint_(rnase_footprint) {
  /*transcript_weights_ = std::vector<double>(length, 1.0);*/
  if (transcript_degradation_rate_ext != 0 || transcript_degradation_rate != 0) {
    if (!(rnase_speed_ != 0 && rnase_footprint_ != 0)) {
      throw std::runtime_error(
        "Please specify 'rnase_speed' and/or 'rnase_footprint'");
    }
  }
}